

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptString::RepeatCore
          (JavascriptString *currentString,charcount_t count,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptString *pJVar6;
  uint local_8c;
  ulong uStack_88;
  charcount_t i;
  size_t bufferDstSize;
  char16 *bufferDst;
  TrackAllocData local_68;
  wchar_t *local_40;
  char16 *buffer;
  uint32 local_30;
  charcount_t cStack_2c;
  bool hasOverflow;
  charcount_t finalBufferCount;
  charcount_t currentLength;
  char16 *currentRawString;
  ScriptContext *scriptContext_local;
  JavascriptString *pJStack_10;
  charcount_t count_local;
  JavascriptString *currentString_local;
  
  currentRawString = (char16 *)scriptContext;
  scriptContext_local._4_4_ = count;
  pJStack_10 = currentString;
  if (currentString == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa34,"(currentString != nullptr)","currentString != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  cVar3 = GetLength(pJStack_10);
  if (cVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa35,"(currentString->GetLength() > 0)",
                                "currentString->GetLength() > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (scriptContext_local._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa36,"(count > 0)","count > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  _finalBufferCount = GetString(pJStack_10);
  cStack_2c = GetLength(pJStack_10);
  local_30 = 0;
  buffer._7_1_ = UInt32Math::Mul(scriptContext_local._4_4_,cStack_2c,&local_30);
  if (!(bool)buffer._7_1_) {
    bVar2 = IsValidCharCount((ulong)local_30);
    if (bVar2) {
      local_30 = local_30 + 1;
      pRVar5 = ScriptContext::GetRecycler((ScriptContext *)currentRawString);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_68,(type_info *)&char16_t::typeinfo,0,(ulong)local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                 ,0xa43);
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_68);
      bufferDstSize =
           (size_t)Memory::AllocateArray<Memory::Recycler,char16_t,false>
                             ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                              (ulong)local_30);
      local_40 = (wchar_t *)bufferDstSize;
      if (cStack_2c == 1) {
        wmemset((wchar_t *)bufferDstSize,(uint)(ushort)*_finalBufferCount,(ulong)(local_30 - 1));
        *(undefined2 *)((long)local_40 + (ulong)(local_30 - 1) * 2) = 0;
      }
      else {
        uStack_88 = (ulong)local_30;
        if (uStack_88 <= cStack_2c) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                      ,0xa4e,"(bufferDstSize > currentLength)",
                                      "bufferDstSize > currentLength");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        for (local_8c = 0; local_8c < scriptContext_local._4_4_; local_8c = local_8c + 1) {
          js_wmemcpy_s((char16 *)bufferDstSize,uStack_88,_finalBufferCount,(ulong)cStack_2c);
          bufferDstSize = bufferDstSize + (ulong)cStack_2c * 2;
          uStack_88 = uStack_88 - cStack_2c;
        }
        if (uStack_88 != 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                      ,0xa56,"(bufferDstSize == 1)","bufferDstSize == 1");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        *(undefined2 *)bufferDstSize = 0;
      }
      pJVar6 = NewWithBuffer((char16 *)local_40,local_30 - 1,(ScriptContext *)currentRawString);
      return pJVar6;
    }
  }
  JavascriptError::ThrowRangeError((ScriptContext *)currentRawString,-0x7ff5e9da,(PCWSTR)0x0);
}

Assistant:

JavascriptString* JavascriptString::RepeatCore(JavascriptString* currentString, charcount_t count, ScriptContext* scriptContext)
    {
        Assert(currentString != nullptr);
        Assert(currentString->GetLength() > 0);
        Assert(count > 0);

        const char16* currentRawString = currentString->GetString();
        charcount_t currentLength = currentString->GetLength();

        charcount_t finalBufferCount = 0;
        bool hasOverflow = UInt32Math::Mul(count, currentLength, &finalBufferCount);
        if (hasOverflow || !IsValidCharCount(finalBufferCount))
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_OutOfBoundString);
        }
        finalBufferCount = finalBufferCount + 1;

        char16* buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, finalBufferCount);

        if (currentLength == 1)
        {
            wmemset(buffer, currentRawString[0], finalBufferCount - 1);
            buffer[finalBufferCount - 1] = '\0';
        }
        else
        {
            char16* bufferDst = buffer;
            size_t bufferDstSize = finalBufferCount;
            AnalysisAssert(bufferDstSize > currentLength);

            for (charcount_t i = 0; i < count; i += 1)
            {
                js_wmemcpy_s(bufferDst, bufferDstSize, currentRawString, currentLength);
                bufferDst += currentLength;
                bufferDstSize -= currentLength;
            }
            Assert(bufferDstSize == 1);
            *bufferDst = '\0';
        }

        return JavascriptString::NewWithBuffer(buffer, finalBufferCount - 1, scriptContext);
    }